

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O1

bool __thiscall
chrono::ChShaftsTorqueConverter::Initialize
          (ChShaftsTorqueConverter *this,shared_ptr<chrono::ChShaft> *mshaft1,
          shared_ptr<chrono::ChShaft> *mshaft2,shared_ptr<chrono::ChShaft> *mshaft_stator)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChSystem *pCVar4;
  
  peVar1 = (mshaft1->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((peVar1 == (element_type *)0x0) ||
      (peVar2 = (mshaft2->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      peVar2 == (element_type *)0x0)) ||
     (peVar3 = (mshaft_stator->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr, peVar3 == (element_type *)0x0)) {
    __assert_fail("mm1 && mm2 && mm_stator",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChShaftsTorqueConverter.cpp"
                  ,0x3a,
                  "bool chrono::ChShaftsTorqueConverter::Initialize(std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>)"
                 );
  }
  if ((peVar1 == peVar2) || (peVar1 == peVar3)) {
    __assert_fail("(mm1 != mm2) && (mm1 != mm_stator)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChShaftsTorqueConverter.cpp"
                  ,0x3b,
                  "bool chrono::ChShaftsTorqueConverter::Initialize(std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>)"
                 );
  }
  pCVar4 = (peVar1->super_ChPhysicsItem).system;
  if ((pCVar4 == (peVar2->super_ChPhysicsItem).system) &&
     (pCVar4 == (peVar3->super_ChPhysicsItem).system)) {
    this->shaft1 = peVar1;
    this->shaft2 = peVar2;
    this->shaft_stator = peVar3;
    (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[6])();
    return true;
  }
  __assert_fail("(mm1->GetSystem() == mm2->GetSystem()) && (mm1->GetSystem() == mm_stator->GetSystem())"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChShaftsTorqueConverter.cpp"
                ,0x3c,
                "bool chrono::ChShaftsTorqueConverter::Initialize(std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>, std::shared_ptr<ChShaft>)"
               );
}

Assistant:

bool ChShaftsTorqueConverter::Initialize(std::shared_ptr<ChShaft> mshaft1,       // input shaft
                                         std::shared_ptr<ChShaft> mshaft2,       // output shaft
                                         std::shared_ptr<ChShaft> mshaft_stator  // stator shaft (often fixed)
) {
    ChShaft* mm1 = mshaft1.get();
    ChShaft* mm2 = mshaft2.get();
    ChShaft* mm_stator = mshaft_stator.get();
    assert(mm1 && mm2 && mm_stator);
    assert((mm1 != mm2) && (mm1 != mm_stator));
    assert((mm1->GetSystem() == mm2->GetSystem()) && (mm1->GetSystem() == mm_stator->GetSystem()));

    shaft1 = mm1;
    shaft2 = mm2;
    shaft_stator = mm_stator;

    SetSystem(shaft1->GetSystem());

    return true;
}